

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

ON_RenderMeshInfo * __thiscall ON_Mesh::GetRenderMeshInfo(ON_Mesh *this)

{
  ON_UserData *p;
  ON_UUID local_30;
  CTtRenderMeshInfoUserData *local_20;
  CTtRenderMeshInfoUserData *pUD;
  ON_Mesh *this_local;
  
  pUD = (CTtRenderMeshInfoUserData *)this;
  local_30 = ON_ClassId::Uuid(&CTtRenderMeshInfoUserData::m_CTtRenderMeshInfoUserData_class_rtti);
  p = ON_Object::GetUserData((ON_Object *)this,&local_30);
  local_20 = CTtRenderMeshInfoUserData::Cast(&p->super_ON_Object);
  if (local_20 == (CTtRenderMeshInfoUserData *)0x0) {
    this_local = (ON_Mesh *)0x0;
  }
  else {
    this_local = (ON_Mesh *)CTtRenderMeshInfoUserData::Info(local_20);
  }
  return (ON_RenderMeshInfo *)this_local;
}

Assistant:

const ON_RenderMeshInfo* ON_Mesh::GetRenderMeshInfo() const
{
  CTtRenderMeshInfoUserData* pUD = CTtRenderMeshInfoUserData::Cast(GetUserData(ON_CLASS_ID(CTtRenderMeshInfoUserData)));
  if (nullptr == pUD)
    return nullptr;
  return &pUD->Info();
}